

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amd_ext_to_khr.cpp
# Opt level: O2

bool spvtools::opt::(anonymous_namespace)::
     ReplaceTrinaryMid<(GLSLstd450)38,(GLSLstd450)41,(GLSLstd450)44>
               (IRContext *ctx,Instruction *inst,
               vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
               *param_3)

{
  Instruction *inst_00;
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  FeatureManager *pFVar4;
  uint32_t set;
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  initializer_list<unsigned_int> init_list_01;
  initializer_list<unsigned_int> init_list_02;
  initializer_list<unsigned_int> init_list_03;
  uint local_e8;
  uint32_t local_e4;
  SmallVector<unsigned_int,_2UL> local_e0;
  undefined1 local_b8 [48];
  Instruction *local_88;
  Instruction *local_80;
  Instruction *local_78;
  IRContext *local_70;
  InstructionBuilder ir_builder;
  OperandList new_operands;
  
  pFVar4 = IRContext::get_feature_mgr(ctx);
  set = pFVar4->extinst_importid_GLSLstd450_;
  if (set == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_b8,"GLSL.std.450",(allocator<char> *)&local_e0);
    IRContext::AddExtInstImport(ctx,(string *)local_b8);
    std::__cxx11::string::_M_dispose();
    pFVar4 = IRContext::get_feature_mgr(ctx);
    set = pFVar4->extinst_importid_GLSLstd450_;
  }
  InstructionBuilder::InstructionBuilder
            (&ir_builder,ctx,inst,kAnalysisInstrToBlockMapping|kAnalysisBegin);
  local_e4 = Instruction::GetSingleWordInOperand(inst,2);
  uVar1 = Instruction::GetSingleWordInOperand(inst,3);
  uVar2 = Instruction::GetSingleWordInOperand(inst,4);
  uVar3 = Instruction::type_id(inst);
  local_b8._0_8_ = (pointer)0x0;
  local_b8._8_8_ = (_func_int **)0x0;
  local_b8._16_8_ = 0;
  local_e0._vptr_SmallVector._0_4_ = uVar1;
  local_e0._vptr_SmallVector._4_4_ = uVar2;
  local_78 = inst;
  local_70 = ctx;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_range_initialize<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_b8,&local_e0);
  local_88 = InstructionBuilder::AddNaryExtendedInstruction
                       (&ir_builder,uVar3,set,0x26,
                        (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_b8);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_b8);
  uVar3 = Instruction::type_id(inst);
  local_b8._0_8_ = (pointer)0x0;
  local_b8._8_8_ = (_func_int **)0x0;
  local_b8._16_8_ = 0;
  local_e0._vptr_SmallVector._0_4_ = uVar1;
  local_e0._vptr_SmallVector._4_4_ = uVar2;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_range_initialize<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_b8,&local_e0,&local_e0.size_
            );
  local_80 = InstructionBuilder::AddNaryExtendedInstruction
                       (&ir_builder,uVar3,set,0x29,
                        (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_b8);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_b8);
  new_operands.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  new_operands.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  new_operands.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  init_list._M_len = 1;
  init_list._M_array = &local_e8;
  local_e8 = set;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_e0,init_list);
  local_b8._0_4_ = SPV_OPERAND_TYPE_ID;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector
            ((SmallVector<unsigned_int,_2UL> *)(local_b8 + 8),&local_e0);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
  emplace_back<spvtools::opt::Operand>(&new_operands,(Operand *)local_b8);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector
            ((SmallVector<unsigned_int,_2UL> *)(local_b8 + 8));
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_e0);
  local_e8 = 0x2c;
  init_list_00._M_len = 1;
  init_list_00._M_array = &local_e8;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_e0,init_list_00);
  local_b8._0_4_ = SPV_OPERAND_TYPE_EXTENSION_INSTRUCTION_NUMBER;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector
            ((SmallVector<unsigned_int,_2UL> *)(local_b8 + 8),&local_e0);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
  emplace_back<spvtools::opt::Operand>(&new_operands,(Operand *)local_b8);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector
            ((SmallVector<unsigned_int,_2UL> *)(local_b8 + 8));
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_e0);
  local_e8 = local_e4;
  init_list_01._M_len = 1;
  init_list_01._M_array = &local_e8;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_e0,init_list_01);
  local_b8._0_4_ = SPV_OPERAND_TYPE_ID;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector
            ((SmallVector<unsigned_int,_2UL> *)(local_b8 + 8),&local_e0);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
  emplace_back<spvtools::opt::Operand>(&new_operands,(Operand *)local_b8);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector
            ((SmallVector<unsigned_int,_2UL> *)(local_b8 + 8));
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_e0);
  local_e8 = Instruction::result_id(local_88);
  init_list_02._M_len = 1;
  init_list_02._M_array = &local_e8;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_e0,init_list_02);
  local_b8._0_4_ = SPV_OPERAND_TYPE_ID;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector
            ((SmallVector<unsigned_int,_2UL> *)(local_b8 + 8),&local_e0);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
  emplace_back<spvtools::opt::Operand>(&new_operands,(Operand *)local_b8);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector
            ((SmallVector<unsigned_int,_2UL> *)(local_b8 + 8));
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_e0);
  local_e8 = Instruction::result_id(local_80);
  init_list_03._M_len = 1;
  init_list_03._M_array = &local_e8;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_e0,init_list_03);
  local_b8._0_4_ = 1;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector
            ((SmallVector<unsigned_int,_2UL> *)(local_b8 + 8),&local_e0);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
  emplace_back<spvtools::opt::Operand>(&new_operands,(Operand *)local_b8);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector
            ((SmallVector<unsigned_int,_2UL> *)(local_b8 + 8));
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_e0);
  inst_00 = local_78;
  Instruction::SetInOperands(local_78,&new_operands);
  IRContext::UpdateDefUse(local_70,inst_00);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
            (&new_operands);
  return true;
}

Assistant:

bool ReplaceTrinaryMid(IRContext* ctx, Instruction* inst,
                       const std::vector<const analysis::Constant*>&) {
  uint32_t glsl405_ext_inst_id =
      ctx->get_feature_mgr()->GetExtInstImportId_GLSLstd450();
  if (glsl405_ext_inst_id == 0) {
    ctx->AddExtInstImport("GLSL.std.450");
    glsl405_ext_inst_id =
        ctx->get_feature_mgr()->GetExtInstImportId_GLSLstd450();
  }

  InstructionBuilder ir_builder(
      ctx, inst,
      IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping);

  uint32_t op1 = inst->GetSingleWordInOperand(2);
  uint32_t op2 = inst->GetSingleWordInOperand(3);
  uint32_t op3 = inst->GetSingleWordInOperand(4);

  Instruction* min = ir_builder.AddNaryExtendedInstruction(
      inst->type_id(), glsl405_ext_inst_id, static_cast<uint32_t>(min_opcode),
      {op2, op3});
  Instruction* max = ir_builder.AddNaryExtendedInstruction(
      inst->type_id(), glsl405_ext_inst_id, static_cast<uint32_t>(max_opcode),
      {op2, op3});

  Instruction::OperandList new_operands;
  new_operands.push_back({SPV_OPERAND_TYPE_ID, {glsl405_ext_inst_id}});
  new_operands.push_back({SPV_OPERAND_TYPE_EXTENSION_INSTRUCTION_NUMBER,
                          {static_cast<uint32_t>(clamp_opcode)}});
  new_operands.push_back({SPV_OPERAND_TYPE_ID, {op1}});
  new_operands.push_back({SPV_OPERAND_TYPE_ID, {min->result_id()}});
  new_operands.push_back({SPV_OPERAND_TYPE_ID, {max->result_id()}});

  inst->SetInOperands(std::move(new_operands));
  ctx->UpdateDefUse(inst);
  return true;
}